

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyScanTable
              (Scl_Tree_t *p,Vec_Ptr_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  float fVar1;
  Vec_Flt_t *pVVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Vec_Flt_t *pVVar9;
  uint *puVar10;
  void *pvVar11;
  Vec_Flt_t *pVVar12;
  int *piVar13;
  void **ppvVar14;
  uint uVar15;
  int iVar16;
  Vec_Flt_t *pVVar17;
  Vec_Ptr_t *pVVar18;
  uint uVar19;
  ulong uVar20;
  Scl_Item_t *pSVar21;
  Vec_Flt_t *local_60;
  Vec_Flt_t *local_58;
  ulong local_38;
  
  uVar19 = pTiming->Child;
  iVar5 = p->nItems;
  if (iVar5 <= (int)uVar19) {
LAB_003d282e:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((int)uVar19 < 0) {
    pSVar21 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar21 = p->pItems + uVar19;
  }
  if (pSVar21 == (Scl_Item_t *)0x0) {
    return 0;
  }
  pcVar7 = p->pContents;
  while( true ) {
    iVar4 = (pSVar21->Key).Beg;
    iVar16 = (pSVar21->Key).End - iVar4;
    iVar4 = strncmp(pcVar7 + iVar4,pName,(long)iVar16);
    if ((iVar4 == 0) && (sVar6 = strlen(pName), iVar16 == (int)sVar6)) break;
    uVar19 = pSVar21->Next;
    if (iVar5 <= (int)uVar19) goto LAB_003d282e;
    if ((int)uVar19 < 0) {
      pSVar21 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar21 = p->pItems + uVar19;
    }
    if (pSVar21 == (Scl_Item_t *)0x0) {
      return 0;
    }
  }
  pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
  if (*pcVar7 != '\0') {
    iVar5 = strcmp(pcVar7,"scalar");
    if (iVar5 == 0) {
      uVar19 = pSVar21->Child;
      if (p->nItems <= (int)uVar19) goto LAB_003d282e;
      if ((int)uVar19 < 0) {
        pSVar21 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar21 = p->pItems + uVar19;
      }
      if (pSVar21 == (Scl_Item_t *)0x0) {
        return 1;
      }
      iVar5 = (pSVar21->Key).Beg;
      iVar4 = (pSVar21->Key).End - iVar5;
      iVar5 = strncmp(p->pContents + iVar5,"values",(long)iVar4);
      if (iVar4 == 6 && iVar5 == 0) {
        pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
        pVVar9 = Scl_LibertyReadFloatVec(pcVar7);
        if (pVVar9->nSize != 1) {
          __assert_fail("Vec_FltSize(vValues) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x426,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pVVar8 = Vec_IntStart((int)pcVar7);
        pVVar18 = vOut;
        Vec_PtrPush(vOut,pVVar8);
        pVVar8 = Vec_IntStart((int)pVVar18);
        Vec_PtrPush(vOut,pVVar8);
        Vec_PtrPush(vOut,pVVar9);
        return 1;
      }
      pcVar7 = "Cannot read \"scalar\" template";
LAB_003d20a3:
      puts(pcVar7);
      return 0;
    }
    iVar5 = vTemples->nSize;
    local_38 = 0xffffffff;
    uVar3 = local_38;
    if (0 < (long)iVar5) {
      uVar20 = 0;
      do {
        if (((uVar20 & 3) == 0) &&
           (iVar4 = strcmp(pcVar7,(char *)vTemples->pArray[uVar20]), uVar3 = uVar20, iVar4 == 0))
        break;
        uVar20 = uVar20 + 1;
        uVar3 = local_38;
      } while ((long)iVar5 != uVar20);
    }
    local_38 = uVar3;
    if ((int)local_38 == -1) {
      pcVar7 = "Template cannot be found in the template library";
      goto LAB_003d20a3;
    }
    uVar19 = pSVar21->Child;
    if (p->nItems <= (int)uVar19) goto LAB_003d282e;
    if ((int)uVar19 < 0) {
      pSVar21 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar21 = p->pItems + uVar19;
    }
    if (pSVar21 == (Scl_Item_t *)0x0) {
      local_58 = (Vec_Flt_t *)0x0;
      pVVar9 = (Vec_Flt_t *)0x0;
      local_60 = (Vec_Flt_t *)0x0;
    }
    else {
      local_60 = (Vec_Flt_t *)0x0;
      pVVar9 = (Vec_Flt_t *)0x0;
      local_58 = (Vec_Flt_t *)0x0;
      do {
        iVar4 = (pSVar21->Key).Beg;
        pcVar7 = p->pContents + iVar4;
        iVar4 = (pSVar21->Key).End - iVar4;
        sVar6 = (size_t)iVar4;
        iVar5 = strncmp(pcVar7,"index_1",sVar6);
        if (iVar4 == 7 && iVar5 == 0) {
          if (local_58 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex1 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x440,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
          local_58 = Scl_LibertyReadFloatVec(pcVar7);
        }
        else {
          iVar5 = strncmp(pcVar7,"index_2",sVar6);
          if ((iVar5 == 0) && (iVar4 == 7)) {
            if (pVVar9 != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex2 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x442,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
            pVVar9 = Scl_LibertyReadFloatVec(pcVar7);
          }
          else {
            iVar5 = strncmp(pcVar7,"values",sVar6);
            if ((iVar5 == 0) && (iVar4 == 6)) {
              if (local_60 != (Vec_Flt_t *)0x0) {
                __assert_fail("vValues == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x444,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
              local_60 = Scl_LibertyReadFloatVec(pcVar7);
            }
          }
        }
        uVar19 = pSVar21->Next;
        if (p->nItems <= (int)uVar19) goto LAB_003d282e;
        if ((int)uVar19 < 0) {
          pSVar21 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar21 = p->pItems + uVar19;
        }
      } while (pSVar21 != (Scl_Item_t *)0x0);
    }
    if ((int)local_38 < -2) {
LAB_003d2907:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((vTemples->nSize <= (int)((int)local_38 + 2U)) ||
       (vTemples->nSize <= (int)((int)local_38 + 3U))) goto LAB_003d2907;
    ppvVar14 = vTemples->pArray;
    pVVar12 = (Vec_Flt_t *)ppvVar14[(int)local_38 + 2U];
    pVVar2 = (Vec_Flt_t *)ppvVar14[(int)local_38 + 3U];
    if (ppvVar14[(long)(int)local_38 + 1] == (void *)0x0) {
      if ((local_58 != (Vec_Flt_t *)0x0) && (local_58->nSize != pVVar12->nSize)) {
        __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                      ,1099,
                      "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      pVVar17 = pVVar2;
      if ((pVVar9 != (Vec_Flt_t *)0x0) && (pVVar17 = pVVar9, pVVar9->nSize != pVVar2->nSize)) {
        __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                      ,0x44c,
                      "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      if (local_58 != (Vec_Flt_t *)0x0) {
        pVVar12 = local_58;
      }
      pVVar12 = Vec_FltDup(pVVar12);
      Vec_PtrPush(vOut,pVVar12);
      pVVar12 = Vec_FltDup(pVVar17);
      Vec_PtrPush(vOut,pVVar12);
      pVVar12 = Vec_FltDup(local_60);
      Vec_PtrPush(vOut,pVVar12);
      goto LAB_003d279a;
    }
    uVar19 = local_60->nSize;
    puVar10 = (uint *)malloc(0x10);
    uVar15 = 0x10;
    if (0xe < uVar19 - 1) {
      uVar15 = uVar19;
    }
    puVar10[1] = 0;
    *puVar10 = uVar15;
    if (uVar15 == 0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc((long)(int)uVar15 << 2);
    }
    *(void **)(puVar10 + 2) = pvVar11;
    if ((pVVar9 != (Vec_Flt_t *)0x0) && (pVVar9->nSize != pVVar12->nSize)) {
      __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                    ,0x457,
                    "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    pVVar17 = pVVar2;
    if ((local_58 != (Vec_Flt_t *)0x0) && (pVVar17 = local_58, local_58->nSize != pVVar2->nSize)) {
      __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                    ,0x458,
                    "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    if (pVVar9 != (Vec_Flt_t *)0x0) {
      pVVar12 = pVVar9;
    }
    if (pVVar17->nSize * pVVar12->nSize != local_60->nSize) {
      __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                    ,0x45c,
                    "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    uVar19 = local_60->nSize;
    if (0 < (int)uVar19) {
      iVar5 = 0;
      do {
        uVar15 = (iVar5 % pVVar17->nSize) * pVVar12->nSize + iVar5 / pVVar17->nSize;
        if (((int)uVar15 < 0) || ((int)uVar19 <= (int)uVar15)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        fVar1 = local_60->pArray[uVar15];
        uVar19 = *puVar10;
        if (puVar10[1] == uVar19) {
          if ((int)uVar19 < 0x10) {
            if (*(void **)(puVar10 + 2) == (void *)0x0) {
              pvVar11 = malloc(0x40);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar10 + 2),0x40);
            }
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar19 * 2;
            if ((int)uVar15 <= (int)uVar19) goto LAB_003d23f6;
            if (*(void **)(puVar10 + 2) == (void *)0x0) {
              pvVar11 = malloc((ulong)uVar19 << 3);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar10 + 2),(ulong)uVar19 << 3);
            }
          }
          *(void **)(puVar10 + 2) = pvVar11;
          *puVar10 = uVar15;
        }
LAB_003d23f6:
        uVar19 = puVar10[1];
        puVar10[1] = uVar19 + 1;
        *(float *)(*(long *)(puVar10 + 2) + (long)(int)uVar19 * 4) = fVar1;
        iVar5 = iVar5 + 1;
        uVar19 = local_60->nSize;
      } while (iVar5 < (int)uVar19);
    }
    if (uVar19 != puVar10[1]) {
      __assert_fail("Vec_FltSize(vValues) == Vec_FltSize(vValues2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                    ,0x464,
                    "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    piVar13 = (int *)malloc(0x10);
    iVar5 = pVVar12->nSize;
    piVar13[1] = iVar5;
    iVar4 = pVVar12->nCap;
    *piVar13 = iVar4;
    if ((long)iVar4 == 0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc((long)iVar4 << 2);
    }
    *(void **)(piVar13 + 2) = pvVar11;
    memcpy(pvVar11,pVVar12->pArray,(long)iVar5 << 2);
    uVar19 = vOut->nCap;
    if (vOut->nSize == uVar19) {
      if ((int)uVar19 < 0x10) {
        if (vOut->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc(0x80);
        }
        else {
          ppvVar14 = (void **)realloc(vOut->pArray,0x80);
        }
        vOut->pArray = ppvVar14;
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar19 * 2;
        if (iVar5 <= (int)uVar19) goto LAB_003d264d;
        if (vOut->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc((ulong)uVar19 << 4);
        }
        else {
          ppvVar14 = (void **)realloc(vOut->pArray,(ulong)uVar19 << 4);
        }
        vOut->pArray = ppvVar14;
      }
      vOut->nCap = iVar5;
    }
LAB_003d264d:
    iVar5 = vOut->nSize;
    uVar19 = iVar5 + 1;
    vOut->nSize = uVar19;
    vOut->pArray[iVar5] = piVar13;
    piVar13 = (int *)malloc(0x10);
    iVar5 = pVVar17->nSize;
    piVar13[1] = iVar5;
    iVar4 = pVVar17->nCap;
    *piVar13 = iVar4;
    if ((long)iVar4 == 0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc((long)iVar4 << 2);
    }
    *(void **)(piVar13 + 2) = pvVar11;
    memcpy(pvVar11,pVVar17->pArray,(long)iVar5 << 2);
    uVar15 = vOut->nCap;
    if (uVar19 == uVar15) {
      if ((int)uVar15 < 0x10) {
        if (vOut->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc(0x80);
        }
        else {
          ppvVar14 = (void **)realloc(vOut->pArray,0x80);
        }
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar15 * 2;
        if (iVar5 <= (int)uVar15) goto LAB_003d270f;
        if (vOut->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc((ulong)uVar15 << 4);
        }
        else {
          ppvVar14 = (void **)realloc(vOut->pArray,(ulong)uVar15 << 4);
        }
      }
      vOut->pArray = ppvVar14;
      vOut->nCap = iVar5;
    }
LAB_003d270f:
    iVar5 = vOut->nSize;
    uVar15 = iVar5 + 1;
    vOut->nSize = uVar15;
    vOut->pArray[iVar5] = piVar13;
    uVar19 = vOut->nCap;
    if (uVar15 == uVar19) {
      if ((int)uVar19 < 0x10) {
        if (vOut->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc(0x80);
        }
        else {
          ppvVar14 = (void **)realloc(vOut->pArray,0x80);
        }
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar19 * 2;
        if (iVar5 <= (int)uVar19) goto LAB_003d2782;
        if (vOut->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc((ulong)uVar19 << 4);
        }
        else {
          ppvVar14 = (void **)realloc(vOut->pArray,(ulong)uVar19 << 4);
        }
      }
      vOut->pArray = ppvVar14;
      vOut->nCap = iVar5;
    }
LAB_003d2782:
    iVar5 = vOut->nSize;
    vOut->nSize = iVar5 + 1;
    vOut->pArray[iVar5] = puVar10;
LAB_003d279a:
    if (local_58 != (Vec_Flt_t *)0x0) {
      if (local_58->pArray != (float *)0x0) {
        free(local_58->pArray);
        local_58->pArray = (float *)0x0;
      }
      free(local_58);
    }
    if (pVVar9 != (Vec_Flt_t *)0x0) {
      if (pVVar9->pArray != (float *)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (float *)0x0;
      }
      free(pVVar9);
    }
    if (local_60 != (Vec_Flt_t *)0x0) {
      if (local_60->pArray != (float *)0x0) {
        free(local_60->pArray);
        local_60->pArray = (float *)0x0;
      }
      free(local_60);
      return 1;
    }
    return 1;
  }
  uVar19 = pSVar21->Child;
  if (p->nItems <= (int)uVar19) goto LAB_003d282e;
  if ((int)uVar19 < 0) {
    pSVar21 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar21 = p->pItems + uVar19;
  }
  if (pSVar21 == (Scl_Item_t *)0x0) {
    pVVar9 = (Vec_Flt_t *)0x0;
    local_58 = (Vec_Flt_t *)0x0;
    local_60 = (Vec_Flt_t *)0x0;
  }
  else {
    local_60 = (Vec_Flt_t *)0x0;
    local_58 = (Vec_Flt_t *)0x0;
    pVVar9 = (Vec_Flt_t *)0x0;
    do {
      iVar4 = (pSVar21->Key).Beg;
      pcVar7 = p->pContents + iVar4;
      iVar4 = (pSVar21->Key).End - iVar4;
      sVar6 = (size_t)iVar4;
      iVar5 = strncmp(pcVar7,"index_1",sVar6);
      if (iVar4 == 7 && iVar5 == 0) {
        if (pVVar9 != (Vec_Flt_t *)0x0) {
          __assert_fail("vIndex1 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x40f,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
        pVVar9 = Scl_LibertyReadFloatVec(pcVar7);
      }
      else {
        iVar5 = strncmp(pcVar7,"index_2",sVar6);
        if ((iVar5 == 0) && (iVar4 == 7)) {
          if (local_58 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex2 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x411,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
          local_58 = Scl_LibertyReadFloatVec(pcVar7);
        }
        else {
          iVar5 = strncmp(pcVar7,"values",sVar6);
          if ((iVar5 == 0) && (iVar4 == 6)) {
            if (local_60 != (Vec_Flt_t *)0x0) {
              __assert_fail("vValues == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x413,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar7 = Scl_LibertyReadString(p,pSVar21->Head);
            local_60 = Scl_LibertyReadFloatVec(pcVar7);
          }
        }
      }
      uVar19 = pSVar21->Next;
      if (p->nItems <= (int)uVar19) goto LAB_003d282e;
      if ((int)uVar19 < 0) {
        pSVar21 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar21 = p->pItems + uVar19;
      }
    } while (pSVar21 != (Scl_Item_t *)0x0);
  }
  if (((pVVar9 == (Vec_Flt_t *)0x0) || (local_58 == (Vec_Flt_t *)0x0)) ||
     (local_60 == (Vec_Flt_t *)0x0)) {
    pcVar7 = "Incomplete table specification";
    goto LAB_003d20a3;
  }
  uVar19 = vOut->nCap;
  if (vOut->nSize == uVar19) {
    if ((int)uVar19 < 0x10) {
      if (vOut->pArray == (void **)0x0) {
        ppvVar14 = (void **)malloc(0x80);
      }
      else {
        ppvVar14 = (void **)realloc(vOut->pArray,0x80);
      }
      vOut->pArray = ppvVar14;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar19 * 2;
      if (iVar5 <= (int)uVar19) goto LAB_003d2531;
      if (vOut->pArray == (void **)0x0) {
        ppvVar14 = (void **)malloc((ulong)uVar19 << 4);
      }
      else {
        ppvVar14 = (void **)realloc(vOut->pArray,(ulong)uVar19 << 4);
      }
      vOut->pArray = ppvVar14;
    }
    vOut->nCap = iVar5;
  }
LAB_003d2531:
  iVar5 = vOut->nSize;
  uVar15 = iVar5 + 1;
  vOut->nSize = uVar15;
  vOut->pArray[iVar5] = pVVar9;
  uVar19 = vOut->nCap;
  if (uVar15 == uVar19) {
    if ((int)uVar19 < 0x10) {
      if (vOut->pArray == (void **)0x0) {
        ppvVar14 = (void **)malloc(0x80);
      }
      else {
        ppvVar14 = (void **)realloc(vOut->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar19 * 2;
      if (iVar5 <= (int)uVar19) goto LAB_003d259f;
      if (vOut->pArray == (void **)0x0) {
        ppvVar14 = (void **)malloc((ulong)uVar19 << 4);
      }
      else {
        ppvVar14 = (void **)realloc(vOut->pArray,(ulong)uVar19 << 4);
      }
    }
    vOut->pArray = ppvVar14;
    vOut->nCap = iVar5;
  }
LAB_003d259f:
  iVar5 = vOut->nSize;
  uVar15 = iVar5 + 1;
  vOut->nSize = uVar15;
  vOut->pArray[iVar5] = local_58;
  uVar19 = vOut->nCap;
  if (uVar15 == uVar19) {
    if ((int)uVar19 < 0x10) {
      if (vOut->pArray == (void **)0x0) {
        ppvVar14 = (void **)malloc(0x80);
      }
      else {
        ppvVar14 = (void **)realloc(vOut->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar19 * 2;
      if (iVar5 <= (int)uVar19) goto LAB_003d2609;
      if (vOut->pArray == (void **)0x0) {
        ppvVar14 = (void **)malloc((ulong)uVar19 << 4);
      }
      else {
        ppvVar14 = (void **)realloc(vOut->pArray,(ulong)uVar19 << 4);
      }
    }
    vOut->pArray = ppvVar14;
    vOut->nCap = iVar5;
  }
LAB_003d2609:
  iVar5 = vOut->nSize;
  vOut->nSize = iVar5 + 1;
  vOut->pArray[iVar5] = local_60;
  return 1;
}

Assistant:

int Scl_LibertyScanTable( Scl_Tree_t * p, Vec_Ptr_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_PtrPush( vOut, vInd1 );
        Vec_PtrPush( vOut, vInd2 );
        Vec_PtrPush( vOut, vValues );
    }
    else if ( !strcmp(pTempl, "scalar") )
    {
        Scl_ItemForEachChild( p, pTable, pItem )
            if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
            {
                assert(vValues == NULL);
                vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
                assert( Vec_FltSize(vValues) == 1 );
                // write entries
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, vValues );
                break;
            }
            else
            { printf( "Cannot read \"scalar\" template\n" ); return 0; }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, Vec_FltDup(vValues) );
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            Vec_Flt_t * vValues2 = Vec_FltAlloc( Vec_FltSize(vValues) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_FltPush( vValues2, Entry );
            }
            assert( Vec_FltSize(vValues) == Vec_FltSize(vValues2) );
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, vValues2 );
        }
        Vec_FltFreeP( &vIndex1 );
        Vec_FltFreeP( &vIndex2 );
        Vec_FltFreeP( &vValues );
    }
    return 1;
}